

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMassInitialize(void *arkode_mem)

{
  int iVar1;
  SUNLinearSolver_Type SVar2;
  char *in_RDI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = arkLs_AccessMassMem((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI,(ARKodeMem *)in_stack_ffffffffffffffe8,
                              (ARKLsMassMem *)in_stack_ffffffffffffffe0);
  if (iVar1 != 0) {
    return iVar1;
  }
  arkLsInitializeMassCounters(in_stack_ffffffffffffffe0);
  if (in_stack_ffffffffffffffe0->M != (SUNMatrix)0x0) {
    if (in_stack_ffffffffffffffe0->mass == (ARKLsMassFn)0x0) {
      arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsMassInitialize",
                      "Missing user-provided mass-matrix routine");
      in_stack_ffffffffffffffe0->last_flag = -3;
      return in_stack_ffffffffffffffe0->last_flag;
    }
    if ((in_stack_ffffffffffffffe0->mtimes == (ARKLsMassTimesVecFn)0x0) &&
       (in_stack_ffffffffffffffe0->M->ops->matvec == (_func_int_SUNMatrix_N_Vector_N_Vector *)0x0))
    {
      arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsMassInitialize",
                      "No available mass matrix-vector product routine");
      in_stack_ffffffffffffffe0->last_flag = -3;
      return in_stack_ffffffffffffffe0->last_flag;
    }
  }
  if (((in_stack_ffffffffffffffe0->M == (SUNMatrix)0x0) &&
      (in_stack_ffffffffffffffe0->mtimes == (ARKLsMassTimesVecFn)0x0)) &&
     (SVar2 = SUNLinSolGetType((SUNLinearSolver)0x114fba5), SVar2 != SUNLINEARSOLVER_MATRIX_EMBEDDED
     )) {
    arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsMassInitialize",
                    "Missing user-provided mass matrix-vector product routine");
    in_stack_ffffffffffffffe0->last_flag = -3;
    iVar1 = in_stack_ffffffffffffffe0->last_flag;
  }
  else if (in_stack_ffffffffffffffe0->LS == (SUNLinearSolver)0x0) {
    arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsMassInitialize",
                    "Missing SUNLinearSolver object");
    in_stack_ffffffffffffffe0->last_flag = -3;
    iVar1 = in_stack_ffffffffffffffe0->last_flag;
  }
  else {
    if (((in_stack_ffffffffffffffe0->M == (SUNMatrix)0x0) &&
        (in_stack_ffffffffffffffe0->pset == (ARKLsMassPrecSetupFn)0x0)) &&
       ((in_stack_ffffffffffffffe0->mtsetup == (ARKLsMassTimesSetupFn)0x0 &&
        (in_stack_ffffffffffffffe8->step_disablemsetup != (ARKTimestepDisableMSetup)0x0)))) {
      (*in_stack_ffffffffffffffe8->step_disablemsetup)(in_RDI);
    }
    SVar2 = SUNLinSolGetType((SUNLinearSolver)0x114fca8);
    if (SVar2 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
      (*in_stack_ffffffffffffffe8->step_disablemsetup)(in_RDI);
    }
    iVar1 = SUNLinSolInitialize((SUNLinearSolver)in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffe0->last_flag = iVar1;
    iVar1 = in_stack_ffffffffffffffe0->last_flag;
  }
  return iVar1;
}

Assistant:

int arkLsMassInitialize(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMassInitialize",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* reset counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* perform checks for matrix-based mass system */
  if (arkls_mem->M != NULL) {
    /* check for user-provided mass matrix constructor */
    if (arkls_mem->mass == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "Missing user-provided mass-matrix routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
    /* check that someone can perform matrix-vector product */
    if ((arkls_mem->mtimes == NULL) && (arkls_mem->M->ops->matvec == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "No available mass matrix-vector product routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
  }

  /* perform checks for matrix-free mass system */
  if ((arkls_mem->M == NULL) && (arkls_mem->mtimes == NULL) &&
      (SUNLinSolGetType(arkls_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsMassInitialize",
                    "Missing user-provided mass matrix-vector product routine");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* ensure that a mass matrix solver exists */
  if (arkls_mem->LS == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLsMassInitialize",
                    "Missing SUNLinearSolver object");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* if M is NULL and neither pset or mtsetup are present, then
     arkLsMassSetup does not need to be called, so set the
     msetup function to NULL */
  if ( (arkls_mem->M == NULL) &&
       (arkls_mem->pset == NULL) &&
       (arkls_mem->mtsetup == NULL) &&
       (ark_mem->step_disablemsetup != NULL) )
    ark_mem->step_disablemsetup(arkode_mem);

  /* When using a matrix-embedded linear solver, disable lsetup call */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
    ark_mem->step_disablemsetup(arkode_mem);

  /* Call LS initialize routine */
  arkls_mem->last_flag = SUNLinSolInitialize(arkls_mem->LS);
  return(arkls_mem->last_flag);
}